

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textool.cpp
# Opt level: O1

char * getGlErrStr(GLenum err)

{
  if ((err - 0x500 < 7) && ((0x67U >> (err & 0x1f) & 1) != 0)) {
    return &DAT_0014425c + *(int *)(&DAT_0014425c + (ulong)(err - 0x500) * 4);
  }
  __assert_fail("!\"unknown error\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/textool/textool.cpp"
                ,0x23,"const char *getGlErrStr(const GLenum)");
}

Assistant:

static const char* getGlErrStr(GLenum const err)
{
    switch (err) {
    case GL_NO_ERROR: return "GL_NO_ERROR";
    case GL_INVALID_ENUM: return "GL_INVALID_ENUM";
    case GL_INVALID_VALUE: return "GL_INVALID_VALUE";
    case GL_INVALID_OPERATION: return "GL_INVALID_OPERATION";
    case GL_INVALID_FRAMEBUFFER_OPERATION: return "GL_INVALID_FRAMEBUFFER_OPERATION";
    case GL_OUT_OF_MEMORY: return "GL_OUT_OF_MEMORY";
#ifdef GL_STACK_UNDERFLOW
    case GL_STACK_UNDERFLOW: return "GL_STACK_UNDERFLOW";
#endif
#ifdef GL_STACK_OVERFLOW
    case GL_STACK_OVERFLOW: return "GL_STACK_OVERFLOW";
#endif
    default:
        assert(!"unknown error");
        return nullptr;
    }
}